

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# narpc_write_request.cc
# Opt level: O0

void __thiscall
NarpcWriteRequest::NarpcWriteRequest
          (NarpcWriteRequest *this,int key,longlong address,shared_ptr<crail::ByteBuffer> *payload)

{
  shared_ptr<crail::ByteBuffer> *psVar1;
  int iVar2;
  element_type *this_00;
  NarpcStorageRequest *in_RCX;
  element_type *in_RDX;
  undefined4 in_ESI;
  shared_ptr<crail::ByteBuffer> *in_RDI;
  
  NarpcStorageRequest::NarpcStorageRequest(in_RCX,(int)((ulong)in_RDI >> 0x20));
  (in_RDI->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_Update_00190728;
  *(undefined4 *)
   ((long)&(in_RDI->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi + 4) = in_ESI;
  in_RDI[1].super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDX;
  psVar1 = in_RDI + 1;
  this_00 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x176054);
  iVar2 = crail::ByteBuffer::remaining(this_00);
  *(int *)&(psVar1->super___shared_ptr<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi = iVar2;
  std::shared_ptr<crail::ByteBuffer>::shared_ptr((shared_ptr<crail::ByteBuffer> *)in_RCX,in_RDI);
  return;
}

Assistant:

NarpcWriteRequest::NarpcWriteRequest(int key, long long address,
                                     shared_ptr<ByteBuffer> payload)
    : NarpcStorageRequest(static_cast<int>(NarpcStorageRequestType::Write)),
      key_(key), address_(address), length_(payload->remaining()),
      payload_(payload) {}